

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildCommand.cxx
# Opt level: O1

cmCTestGenericHandler * __thiscall cmCTestBuildCommand::InitializeHandler(cmCTestBuildCommand *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *pcVar2;
  cmCTest *pcVar3;
  bool bVar4;
  int iVar5;
  cmCTestBuildHandler *pcVar6;
  char *pcVar7;
  char *pcVar8;
  string *psVar9;
  size_t sVar10;
  cmGlobalGenerator *pcVar11;
  ostream *poVar12;
  char *pcVar13;
  char *__s;
  char *pcVar14;
  pointer pcVar15;
  string dir;
  string buildCommand;
  string e;
  string local_280;
  string local_260;
  cmake *local_240;
  char *local_238;
  cmCTestBuildHandler *local_230;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  pcVar6 = cmCTest::GetBuildHandler((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest);
  (*(pcVar6->super_cmCTestGenericHandler)._vptr_cmCTestGenericHandler[3])(pcVar6);
  this->Handler = pcVar6;
  pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  pcVar15 = local_1a8 + 0x10;
  local_1a8._0_8_ = pcVar15;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"CTEST_BUILD_COMMAND","");
  pcVar7 = cmMakefile::GetDefinition(pcVar2,(string *)local_1a8);
  if ((pointer)local_1a8._0_8_ != pcVar15) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  if ((pcVar7 == (char *)0x0) || (*pcVar7 == '\0')) {
    pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
    local_1a8._0_8_ = pcVar15;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"CTEST_CMAKE_GENERATOR","");
    pcVar7 = cmMakefile::GetDefinition(pcVar2,(string *)local_1a8);
    if ((pointer)local_1a8._0_8_ != pcVar15) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
    local_1a8._0_8_ = pcVar15;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"CTEST_BUILD_CONFIGURATION","");
    pcVar8 = cmMakefile::GetDefinition(pcVar2,(string *)local_1a8);
    if ((pointer)local_1a8._0_8_ != pcVar15) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    pcVar14 = (this->super_cmCTestHandlerCommand).Values.
              super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
              super__Vector_impl_data._M_start[10];
    if (((pcVar14 == (char *)0x0) || (*pcVar14 == '\0')) &&
       ((pcVar8 == (char *)0x0 || (pcVar14 = pcVar8, *pcVar8 == '\0')))) {
      psVar9 = cmCTest::GetConfigType_abi_cxx11_
                         ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest);
      pcVar14 = (psVar9->_M_dataplus)._M_p;
    }
    pcVar8 = (this->super_cmCTestHandlerCommand).Values.
             super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
             super__Vector_impl_data._M_start[0xb];
    if ((pcVar8 == (char *)0x0) || (*pcVar8 == '\0')) {
      pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
      local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"CTEST_BUILD_FLAGS","");
      pcVar8 = cmMakefile::GetDefinition(pcVar2,&local_1c8);
      bVar4 = true;
    }
    else {
      bVar4 = false;
    }
    if ((bVar4) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2)) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
    __s = (this->super_cmCTestHandlerCommand).Values.
          super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
          super__Vector_impl_data._M_start[9];
    local_230 = pcVar6;
    if ((__s == (char *)0x0) || (*__s == '\0')) {
      pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
      local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"CTEST_BUILD_TARGET","");
      __s = cmMakefile::GetDefinition(pcVar2,&local_1e8);
      bVar4 = true;
    }
    else {
      bVar4 = false;
    }
    if ((bVar4) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2)) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    if ((pcVar7 == (char *)0x0) || (*pcVar7 == '\0')) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "has no project to build. If this is a \"built with CMake\" project, verify that CTEST_CMAKE_GENERATOR is set. Otherwise, set CTEST_BUILD_COMMAND to build the project with a custom command line."
                 ,0xbf);
      std::__cxx11::stringbuf::str();
      cmCommand::SetError((cmCommand *)this,&local_260);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_260._M_dataplus._M_p != &local_260.field_2) {
        operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      return (cmCTestGenericHandler *)0x0;
    }
    pcVar13 = "Release";
    if (pcVar14 != (char *)0x0) {
      pcVar13 = pcVar14;
    }
    local_238 = pcVar8;
    if (this->GlobalGenerator != (cmGlobalGenerator *)0x0) {
      (*this->GlobalGenerator->_vptr_cmGlobalGenerator[3])(local_1a8);
      iVar5 = std::__cxx11::string::compare(local_1a8);
      if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
      if (iVar5 != 0) {
        if (this->GlobalGenerator != (cmGlobalGenerator *)0x0) {
          (*this->GlobalGenerator->_vptr_cmGlobalGenerator[1])();
        }
        this->GlobalGenerator = (cmGlobalGenerator *)0x0;
      }
    }
    if (this->GlobalGenerator == (cmGlobalGenerator *)0x0) {
      local_240 = cmMakefile::GetCMakeInstance
                            ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.
                             super_cmCommand.Makefile);
      local_1a8._0_8_ = local_1a8 + 0x10;
      sVar10 = strlen(pcVar7);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,pcVar7,pcVar7 + sVar10);
      pcVar11 = cmake::CreateGlobalGenerator(local_240,(string *)local_1a8);
      this->GlobalGenerator = pcVar11;
      pcVar15 = local_1a8 + 0x10;
      if ((pointer)local_1a8._0_8_ != pcVar15) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
      if (this->GlobalGenerator == (cmGlobalGenerator *)0x0) {
        local_1a8._0_8_ = pcVar15;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1a8,"could not create generator named \"","");
        std::__cxx11::string::append(local_1a8);
        std::__cxx11::string::append(local_1a8);
        cmMakefile::IssueMessage
                  ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile
                   ,FATAL_ERROR,(string *)local_1a8);
        cmSystemTools::s_FatalErrorOccured = true;
        if ((pointer)local_1a8._0_8_ == pcVar15) {
          cmSystemTools::s_FatalErrorOccured = true;
          return (cmCTestGenericHandler *)0x0;
        }
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
        return (cmCTestGenericHandler *)0x0;
      }
    }
    pcVar7 = "Debug";
    if (*pcVar13 != '\0') {
      pcVar7 = pcVar13;
    }
    pcVar3 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
    local_1a8._0_8_ = local_1a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"BuildDirectory","");
    cmCTest::GetCTestConfiguration(&local_260,pcVar3,(string *)local_1a8);
    pcVar8 = local_238;
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    pcVar11 = this->GlobalGenerator;
    if (__s == (char *)0x0) {
      __s = "";
    }
    local_1a8._0_8_ = local_1a8 + 0x10;
    sVar10 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,__s,__s + sVar10);
    paVar1 = &local_280.field_2;
    local_280._M_dataplus._M_p = (pointer)paVar1;
    sVar10 = strlen(pcVar7);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,pcVar7,pcVar7 + sVar10);
    pcVar6 = local_230;
    pcVar7 = "";
    if (pcVar8 != (char *)0x0) {
      pcVar7 = pcVar8;
    }
    local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
    sVar10 = strlen(pcVar7);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,pcVar7,pcVar7 + sVar10);
    bVar4 = cmMakefile::IgnoreErrorsCMP0061
                      ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.
                       Makefile);
    cmGlobalGenerator::GenerateCMakeBuildCommand
              (&local_228,pcVar11,(string *)local_1a8,&local_280,&local_208,bVar4);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != paVar1) {
      operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"SetMakeCommand:",0xf);
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,local_228._M_dataplus._M_p,local_228._M_string_length)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
    pcVar3 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar3,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestBuildCommand.cxx"
                 ,0x78,local_280._M_dataplus._M_p,(this->super_cmCTestHandlerCommand).Quiet);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != paVar1) {
      operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    cmCTest::SetCTestConfiguration
              ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,"MakeCommand",
               local_228._M_dataplus._M_p,(this->super_cmCTestHandlerCommand).Quiet);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != &local_228.field_2) {
      operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != &local_260.field_2) {
      operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    cmCTest::SetCTestConfiguration
              ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,"MakeCommand",pcVar7,
               (this->super_cmCTestHandlerCommand).Quiet);
  }
  pcVar15 = local_1a8 + 0x10;
  pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  local_1a8._0_8_ = pcVar15;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"CTEST_USE_LAUNCHERS","");
  pcVar7 = cmMakefile::GetDefinition(pcVar2,(string *)local_1a8);
  if ((pointer)local_1a8._0_8_ != pcVar15) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  if (pcVar7 != (char *)0x0) {
    cmCTest::SetCTestConfiguration
              ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,"UseLaunchers",pcVar7,
               (this->super_cmCTestHandlerCommand).Quiet);
  }
  pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  local_1a8._0_8_ = pcVar15;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a8,"CTEST_LABELS_FOR_SUBPROJECTS","");
  pcVar7 = cmMakefile::GetDefinition(pcVar2,(string *)local_1a8);
  if ((pointer)local_1a8._0_8_ != pcVar15) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  if (pcVar7 != (char *)0x0) {
    cmCTest::SetCTestConfiguration
              ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,"LabelsForSubprojects"
               ,pcVar7,(this->super_cmCTestHandlerCommand).Quiet);
  }
  (pcVar6->super_cmCTestGenericHandler).Quiet = (this->super_cmCTestHandlerCommand).Quiet;
  return &pcVar6->super_cmCTestGenericHandler;
}

Assistant:

cmCTestGenericHandler* cmCTestBuildCommand::InitializeHandler()
{
  cmCTestBuildHandler* handler = this->CTest->GetBuildHandler();
  handler->Initialize();

  this->Handler = handler;

  const char* ctestBuildCommand =
    this->Makefile->GetDefinition("CTEST_BUILD_COMMAND");
  if (ctestBuildCommand && *ctestBuildCommand) {
    this->CTest->SetCTestConfiguration("MakeCommand", ctestBuildCommand,
                                       this->Quiet);
  } else {
    const char* cmakeGeneratorName =
      this->Makefile->GetDefinition("CTEST_CMAKE_GENERATOR");

    // Build configuration is determined by: CONFIGURATION argument,
    // or CTEST_BUILD_CONFIGURATION script variable, or
    // CTEST_CONFIGURATION_TYPE script variable, or ctest -C command
    // line argument... in that order.
    //
    const char* ctestBuildConfiguration =
      this->Makefile->GetDefinition("CTEST_BUILD_CONFIGURATION");
    const char* cmakeBuildConfiguration =
      (this->Values[ctb_CONFIGURATION] && *this->Values[ctb_CONFIGURATION])
      ? this->Values[ctb_CONFIGURATION]
      : ((ctestBuildConfiguration && *ctestBuildConfiguration)
           ? ctestBuildConfiguration
           : this->CTest->GetConfigType().c_str());

    const char* cmakeBuildAdditionalFlags =
      (this->Values[ctb_FLAGS] && *this->Values[ctb_FLAGS])
      ? this->Values[ctb_FLAGS]
      : this->Makefile->GetDefinition("CTEST_BUILD_FLAGS");
    const char* cmakeBuildTarget =
      (this->Values[ctb_TARGET] && *this->Values[ctb_TARGET])
      ? this->Values[ctb_TARGET]
      : this->Makefile->GetDefinition("CTEST_BUILD_TARGET");

    if (cmakeGeneratorName && *cmakeGeneratorName) {
      if (!cmakeBuildConfiguration) {
        cmakeBuildConfiguration = "Release";
      }
      if (this->GlobalGenerator) {
        if (this->GlobalGenerator->GetName() != cmakeGeneratorName) {
          delete this->GlobalGenerator;
          this->GlobalGenerator = nullptr;
        }
      }
      if (!this->GlobalGenerator) {
        this->GlobalGenerator =
          this->Makefile->GetCMakeInstance()->CreateGlobalGenerator(
            cmakeGeneratorName);
        if (!this->GlobalGenerator) {
          std::string e = "could not create generator named \"";
          e += cmakeGeneratorName;
          e += "\"";
          this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e);
          cmSystemTools::SetFatalErrorOccured();
          return nullptr;
        }
      }
      if (strlen(cmakeBuildConfiguration) == 0) {
        const char* config = nullptr;
#ifdef CMAKE_INTDIR
        config = CMAKE_INTDIR;
#endif
        if (!config) {
          config = "Debug";
        }
        cmakeBuildConfiguration = config;
      }

      std::string dir = this->CTest->GetCTestConfiguration("BuildDirectory");
      std::string buildCommand =
        this->GlobalGenerator->GenerateCMakeBuildCommand(
          cmakeBuildTarget ? cmakeBuildTarget : "", cmakeBuildConfiguration,
          cmakeBuildAdditionalFlags ? cmakeBuildAdditionalFlags : "",
          this->Makefile->IgnoreErrorsCMP0061());
      cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                         "SetMakeCommand:" << buildCommand << "\n",
                         this->Quiet);
      this->CTest->SetCTestConfiguration("MakeCommand", buildCommand.c_str(),
                                         this->Quiet);
    } else {
      std::ostringstream ostr;
      /* clang-format off */
      ostr << "has no project to build. If this is a "
        "\"built with CMake\" project, verify that CTEST_CMAKE_GENERATOR "
        "is set. Otherwise, set CTEST_BUILD_COMMAND to build the project "
        "with a custom command line.";
      /* clang-format on */
      this->SetError(ostr.str());
      return nullptr;
    }
  }

  if (const char* useLaunchers =
        this->Makefile->GetDefinition("CTEST_USE_LAUNCHERS")) {
    this->CTest->SetCTestConfiguration("UseLaunchers", useLaunchers,
                                       this->Quiet);
  }

  if (const char* labelsForSubprojects =
        this->Makefile->GetDefinition("CTEST_LABELS_FOR_SUBPROJECTS")) {
    this->CTest->SetCTestConfiguration("LabelsForSubprojects",
                                       labelsForSubprojects, this->Quiet);
  }

  handler->SetQuiet(this->Quiet);
  return handler;
}